

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O1

int main(int argc,char **argv)

{
  code *pcVar1;
  undefined8 uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  function<void_()> *extraout_RDX;
  function<void_()> *extraout_RDX_00;
  function<void_()> *extraout_RDX_01;
  function<void_()> *fn;
  shared_ptr<JSONHandler> sVar3;
  size_type __dnew;
  JSONHandler h;
  shared_ptr<JSONHandler> h_1;
  JSON j;
  size_type __dnew_1;
  code *local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  long local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- scalar --",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  JSONHandler::JSONHandler((JSONHandler *)(local_98 + 0x10));
  local_b8[1] = (code *)0x0;
  local_b8[0] = print_string;
  local_a8._8_6_ = 0x11fa72;
  local_a8._M_local_buf[0xe] = '\0';
  local_a8._M_local_buf[0xf] = '\0';
  local_a8._M_allocated_capacity._0_2_ = 0xfa7e;
  local_a8._M_allocated_capacity._2_4_ = 0x11;
  local_a8._M_local_buf[6] = '\0';
  local_a8._M_local_buf[7] = '\0';
  JSONHandler::addStringHandler((JSONHandler *)(local_98 + 0x10),(string_handler_t *)local_b8);
  pcVar1 = (code *)CONCAT17(local_a8._M_local_buf[7],
                            CONCAT16(local_a8._M_local_buf[6],
                                     CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                              local_a8._M_allocated_capacity._0_2_)));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(local_b8,local_b8,3);
  }
  local_68._0_8_ =
       (__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>
       )0x226f7461746f7022;
  local_78._8_8_ = 8;
  local_68._8_8_ = local_68._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = (JSONHandler *)local_68;
  JSON::parse((JSON *)local_58,(string *)local_78);
  if ((JSONHandler *)local_78._0_8_ != (JSONHandler *)local_68) {
    operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
  }
  local_68._0_2_ = 0x2e;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_98._0_8_ = local_58._0_8_;
  local_98._8_8_ = local_58._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
    }
  }
  local_78._0_8_ = (JSONHandler *)local_68;
  JSONHandler::handle((JSONHandler *)(local_98 + 0x10),(string *)local_78,(JSON *)local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((JSONHandler *)local_78._0_8_ != (JSONHandler *)local_68) {
    operator_delete((void *)local_78._0_8_,local_68._0_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  JSONHandler::~JSONHandler((JSONHandler *)(local_98 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- all --",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  make_all_handler();
  local_98._0_8_ = (__uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>)0xc3;
  local_b8[0] = (code *)&local_a8;
  __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_b8,(ulong)local_98);
  uVar2 = local_98._0_8_;
  local_a8._M_allocated_capacity._0_2_ = (undefined2)local_98._0_8_;
  local_a8._M_allocated_capacity._2_4_ = SUB84(local_98._0_8_,2);
  local_a8._M_local_buf[6] = SUB81(local_98._0_8_,6);
  local_a8._M_local_buf[7] = SUB81(local_98._0_8_,7);
  local_b8[0] = (code *)__dest;
  memcpy(__dest,
         "{\n   \"one\": \"potato\",\n   \"two\": 3.14,\n   \"three\": true,\n   \"four\": [\"a\", 1],\n   \"five\": [\"x\", false, \"y\", null, true],\n   \"phour\": null,\n   \"six\": {\"a\": {\"b\": \"quack\", \"Q\": \"baaa\"}, \"b\": \"moo\"}\n}"
         ,0xc3);
  local_b8[1] = (code *)uVar2;
  __dest->_M_local_buf[uVar2] = '\0';
  JSON::parse((JSON *)local_58,(string *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
  }
  local_a8._M_allocated_capacity._0_2_ = 0x2e;
  local_b8[1] = (code *)0x1;
  local_98._0_8_ = local_58._0_8_;
  local_98._8_8_ = local_58._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
    }
  }
  local_b8[0] = (code *)&local_a8;
  JSONHandler::handle((JSONHandler *)local_78._0_8_,(string *)local_b8,(JSON *)local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"-- fallback --",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  local_30 = 0x1a;
  local_b8[0] = (code *)&local_a8;
  local_b8[0] = (code *)std::__cxx11::string::_M_create((ulong *)local_b8,(ulong)&local_30);
  local_a8._M_allocated_capacity._0_2_ = (undefined2)local_30;
  local_a8._M_allocated_capacity._2_4_ = (undefined4)((ulong)local_30 >> 0x10);
  local_a8._M_local_buf[6] = (char)((ulong)local_30 >> 0x30);
  local_a8._M_local_buf[7] = (char)((ulong)local_30 >> 0x38);
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 10) = '\"';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xb) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xc) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xd) = '\"';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xe) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xf) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x10) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x11) = '-';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x12) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x13) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x14) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x15) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x16) = 'y';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x17) = '\"';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x18) = '\n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0x19) = '}';
  *(undefined8 *)local_b8[0] = 0x6966222020200a7b;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 8) = 'v';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 9) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 10) = '\"';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xb) = ':';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xc) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xd) = '\"';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xe) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8[0] + 0xf) = 'o';
  local_b8[1] = (code *)local_30;
  ((char *)local_b8[0])[local_30] = '\0';
  JSON::parse((JSON *)(local_98 + 0x10),(string *)local_b8);
  uVar2 = local_58._8_8_;
  local_58._8_8_ = p_Stack_80;
  local_58._0_8_ = local_98._16_8_;
  local_98._16_8_ = 0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
  }
  local_a8._M_allocated_capacity._0_2_ = 0x2e;
  local_b8[1] = (code *)0x1;
  local_98._16_8_ = local_58._0_8_;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
    }
  }
  local_b8[0] = (code *)&local_a8;
  JSONHandler::handle((JSONHandler *)local_78._0_8_,(string *)local_b8,(JSON *)(local_98 + 0x10));
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- errors --",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  sVar3 = make_all_handler();
  uVar2 = local_98._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
    }
  }
  local_a8._M_allocated_capacity._0_2_ = 0x6162;
  local_a8._M_allocated_capacity._2_4_ = 0x79742064;
  local_a8._M_local_buf[6] = 'p';
  local_a8._M_local_buf[7] = 'e';
  local_a8._8_6_ = 0x6f7420746120;
  local_a8._M_local_buf[0xe] = 'p';
  local_b8[1] = (code *)0xf;
  local_a8._M_local_buf[0xf] = '\0';
  local_78._8_8_ = 0;
  local_68._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/json_handler.cc:134:26)>
       ::_M_invoke;
  local_68._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/json_handler.cc:134:26)>
       ::_M_manager;
  local_b8[0] = (code *)&local_a8;
  local_78._0_8_ = (element_type *)local_98;
  test_errors::anon_class_16_1_54a39808::operator()
            ((anon_class_16_1_54a39808 *)local_b8,(string *)local_78,
             (function<void_()> *)
             sVar3.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  fn = extraout_RDX;
  if ((__uniq_ptr_data<JSONHandler::Members,_std::default_delete<JSONHandler::Members>,_true,_true>)
      local_68._0_8_ !=
      (tuple<JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>)0x0) {
    (*(code *)local_68._0_8_)(local_78,local_78,3);
    fn = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
    fn = extraout_RDX_01;
  }
  local_a8._M_allocated_capacity._0_2_ = 0x6e75;
  local_a8._M_allocated_capacity._2_4_ = 0x65707865;
  local_a8._M_local_buf[6] = 'c';
  local_a8._M_local_buf[7] = 't';
  local_a8._8_6_ = 0x79656b206465;
  local_b8[1] = (code *)0xe;
  local_a8._M_local_buf[0xe] = '\0';
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/json_handler.cc:135:25)>
       ::_M_invoke;
  local_48._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/json_handler.cc:135:25)>
       ::_M_manager;
  local_b8[0] = (code *)&local_a8;
  local_58._0_8_ = (element_type *)local_98;
  test_errors::anon_class_16_1_54a39808::operator()
            ((anon_class_16_1_54a39808 *)local_b8,(string *)local_58,fn);
  if ((code *)local_48._0_8_ != (code *)0x0) {
    (*(code *)local_48._0_8_)(local_58,local_58,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0] != &local_a8) {
    operator_delete(local_b8[0],
                    CONCAT17(local_a8._M_local_buf[7],
                             CONCAT16(local_a8._M_local_buf[6],
                                      CONCAT42(local_a8._M_allocated_capacity._2_4_,
                                               local_a8._M_allocated_capacity._0_2_))) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    test_scalar();
    test_all();
    test_errors();
    return 0;
}